

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_test.cc
# Opt level: O3

void __thiscall PageHeapTest_Stats_Test::TestBody(PageHeapTest_Stats_Test *this)

{
  SpinLockHolder ph;
  PageHeap *this_00;
  Span *span;
  Span *span_00;
  bool bVar1;
  SpinLockHolder local_30;
  SpinLockHolder l;
  
  this_00 = (PageHeap *)operator_new(0x1830e0);
  tcmalloc::PageHeap::PageHeap(this_00,1);
  l.lock_ = (SpinLock *)this_00;
  CheckStats(this_00,0,0,0);
  span = tcmalloc::PageHeap::NewWithSizeClass(this_00,0x100,0);
  CheckStats(this_00,0x100,0,0);
  span_00 = tcmalloc::PageHeap::SplitForTest(this_00,span,0x80);
  tcmalloc::PageHeap::Delete(this_00,span_00);
  CheckStats(this_00,0x100,0x80,0);
  local_30.lock_ = &this_00->lock_;
  LOCK();
  bVar1 = (this_00->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    (this_00->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar1) {
    SpinLock::SlowLock(local_30.lock_);
  }
  ph.lock_ = l.lock_;
  tcmalloc::PageHeap::ReleaseAtLeastNPages((PageHeap *)l.lock_,1);
  SpinLockHolder::~SpinLockHolder(&local_30);
  CheckStats((PageHeap *)ph.lock_,0x100,0,0x80);
  tcmalloc::PageHeap::Delete((PageHeap *)ph.lock_,span);
  CheckStats((PageHeap *)ph.lock_,0x100,0x80,0x80);
  std::
  _Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
  ::~_Rb_tree((_Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
               *)(ph.lock_ + 0x60012));
  std::
  _Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
  ::~_Rb_tree((_Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
               *)(ph.lock_ + 0x60006));
  operator_delete(ph.lock_,0x1830e0);
  return;
}

Assistant:

TEST(PageHeapTest, Stats) {
  std::unique_ptr<tcmalloc::PageHeap> ph(new tcmalloc::PageHeap());

  // Empty page heap
  CheckStats(ph.get(), 0, 0, 0);

  // Allocate a span 's1'
  tcmalloc::Span* s1 = ph->New(256);
  CheckStats(ph.get(), 256, 0, 0);

  // Split span 's1' into 's1', 's2'.  Delete 's2'
  tcmalloc::Span* s2 = ph->SplitForTest(s1, 128);
  ph->Delete(s2);
  CheckStats(ph.get(), 256, 128, 0);

  // Unmap deleted span 's2'
  {
      SpinLockHolder l(ph->pageheap_lock());
      ph->ReleaseAtLeastNPages(1);
  }
  CheckStats(ph.get(), 256, 0, 128);

  // Delete span 's1'
  ph->Delete(s1);
  CheckStats(ph.get(), 256, 128, 128);
}